

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O3

Value<char> * __thiscall Qentem::Value<char>::operator[](Value<char> *this,SizeT index)

{
  Value<char> *pVVar1;
  uint uVar2;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_38;
  undefined1 local_28;
  
  if (this->type_ == Object) {
    if (index < (this->field_0).array_.index_) {
      uVar2 = (this->field_0).array_.capacity_;
      pVVar1 = (this->field_0).array_.storage_;
      if (*(int *)(&pVVar1[(ulong)index * 2].type_ + (ulong)uVar2 * 4) != 0) {
        return (Value<char> *)((long)&pVVar1[(ulong)index * 2 + 1].field_0 + (ulong)uVar2 * 4);
      }
    }
LAB_00139cba:
    reset(this);
    this->type_ = Array;
    uVar2 = (this->field_0).array_.index_;
  }
  else {
    if (this->type_ != Array) goto LAB_00139cba;
    uVar2 = (this->field_0).array_.index_;
    if (index < uVar2) goto LAB_00139d00;
  }
  if (uVar2 == index) {
    local_28 = 0;
    local_38.array_.storage_ = (Value<char> *)0x0;
    local_38._8_8_ = 0;
    Array<Qentem::Value<char>_>::operator+=
              ((Array<Qentem::Value<char>_> *)this,(Value<char> *)&local_38.array_);
    ~Value((Value<char> *)&local_38.array_);
  }
  else {
    Array<Qentem::Value<char>_>::ResizeAndInitialize((Array<Qentem::Value<char>_> *)this,index + 1);
  }
LAB_00139d00:
  return (this->field_0).array_.storage_ + index;
}

Assistant:

Value &operator[](SizeT index) {
        const ValueType type = Type();

        if (type == ValueType::Array) {
            if (array_.Size() > index) {
                return (array_.Storage()[index]);
            }
        } else {
            if (type == ValueType::Object) {
                Value *val = object_.GetValue(index);

                if (val != nullptr) {
                    return *val;
                }
            }

            reset();
            setTypeToArray();
        }

        if (array_.Size() == index) {
            array_ += Value{};
        } else {
            array_.ResizeAndInitialize(index + SizeT{1});
        }

        return (array_.Storage()[index]);
    }